

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O2

NodeAVL * avlRotateRight(NodeAVL *p)

{
  NodeAVL *nd;
  NodeAVL *pNVar1;
  
  nd = p->left;
  pNVar1 = nd->right;
  p->left = pNVar1;
  if (pNVar1 != (NodeAVL *)0x0) {
    pNVar1->parent = p;
  }
  nd->right = p;
  pNVar1 = p->parent;
  p->parent = nd;
  nd->parent = pNVar1;
  avlFixHeight(p);
  avlFixHeight(nd);
  return nd;
}

Assistant:

static
NodeAVL* avlRotateRight( NodeAVL* p ){
    #ifdef DEBUG_AVL
      printf( "avlRotateRight id=%d\n", p->id );
    #endif
    NodeAVL* q = p->left;
    p->left = q->right;
    if( q->right ) q->right->parent = p;
    q->right = p;
    NodeAVL* pp = p->parent;
    p->parent = q;
    q->parent = pp;
    avlFixHeight(p);
    avlFixHeight(q);
    return q;
}